

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Expression * __thiscall
wasm::ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::
findBreakTarget(ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                *this,Name name)

{
  Id IVar1;
  pointer ppEVar2;
  bool bVar3;
  bool bVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  uint uVar7;
  long lVar8;
  array<wasm::Expression_*,_10UL> *paVar9;
  
  pEVar6 = (Expression *)(this->controlFlowStack).usedFixed;
  ppEVar2 = (this->controlFlowStack).flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar8 = (long)(this->controlFlowStack).flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3;
  if ((long)&pEVar6->_id + lVar8 == 0) {
    __assert_fail("!controlFlowStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                  ,0x18b,
                  "Expression *wasm::ControlFlowWalker<wasm::CoalesceLocals>::findBreakTarget(Name) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>]"
                 );
  }
  uVar7 = ((int)lVar8 + (int)pEVar6) - 1;
  do {
    paVar9 = (array<wasm::Expression_*,_10UL> *)(ppEVar2 + -10);
    if (uVar7 < 10) {
      paVar9 = &(this->controlFlowStack).fixed;
    }
    pEVar5 = paVar9->_M_elems[uVar7];
    IVar1 = pEVar5->_id;
    if ((int)IVar1 < 3) {
      if (IVar1 != BlockId) {
        if (IVar1 != IfId) {
LAB_00688bad:
          __assert_fail("curr->template is<If>() || curr->template is<Try>()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                        ,0x199,
                        "Expression *wasm::ControlFlowWalker<wasm::CoalesceLocals>::findBreakTarget(Name) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>]"
                       );
        }
        goto LAB_00688b6a;
      }
      if ((char *)pEVar5[1].type.id != name.super_IString.str._M_str) goto LAB_00688b72;
      bVar3 = false;
      pEVar6 = pEVar5;
    }
    else {
      if (IVar1 == LoopId) {
        if ((char *)pEVar5[1].type.id != name.super_IString.str._M_str) goto LAB_00688b6a;
        bVar3 = false;
      }
      else {
        if (IVar1 != TryId) goto LAB_00688bad;
LAB_00688b6a:
        bVar3 = true;
        pEVar5 = pEVar6;
      }
      pEVar6 = pEVar5;
      if (bVar3) {
LAB_00688b72:
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
    }
    bVar4 = false;
    if (bVar3) {
      if (uVar7 == 0) {
        uVar7 = 0;
        pEVar6 = (Expression *)0x0;
      }
      else {
        uVar7 = uVar7 - 1;
        bVar4 = true;
      }
    }
    else {
      bVar4 = false;
    }
    if (!bVar4) {
      return pEVar6;
    }
  } while( true );
}

Assistant:

Expression* findBreakTarget(Name name) {
    assert(!controlFlowStack.empty());
    Index i = controlFlowStack.size() - 1;
    while (true) {
      auto* curr = controlFlowStack[i];
      if (Block* block = curr->template dynCast<Block>()) {
        if (name == block->name) {
          return curr;
        }
      } else if (Loop* loop = curr->template dynCast<Loop>()) {
        if (name == loop->name) {
          return curr;
        }
      } else {
        // an if or try, ignorable
        assert(curr->template is<If>() || curr->template is<Try>());
      }
      if (i == 0) {
        return nullptr;
      }
      i--;
    }
  }